

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::OptSrc(GlobOpt *this,Opnd *opnd,Instr **pInstr,Value **indirIndexValRef,
               IndirOpnd *parentIndirOpnd)

{
  OpCode OVar1;
  ushort uVar2;
  Loop *loop;
  code *pcVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType_00;
  bool bVar4;
  OpndKind OVar5;
  BOOLEAN BVar6;
  ArgSlot AVar7;
  ValueType valueType_01;
  ObjectType OVar8;
  ObjectType OVar9;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar10;
  uint uVar11;
  uint sourceContextId;
  uint functionId;
  int32 intConst;
  undefined4 *puVar12;
  Value *pVVar13;
  StackSym *this_00;
  JITTimeProfileInfo *this_01;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *this_02;
  PropertySym *pPVar15;
  Value *pVVar16;
  PropertySym *pPVar17;
  PropertySymOpnd *pPVar18;
  ProfiledInstr *pPVar19;
  IndirOpnd *pIVar20;
  RegOpnd *pRVar21;
  SymOpnd *pSVar22;
  SymKind SVar23;
  uint uVar24;
  Instr *pIVar25;
  BasicBlock *pBVar26;
  _func_int **pp_Var27;
  GlobOpt *pGVar28;
  ValueType *pVVar29;
  SymID *key;
  Opnd *pOVar30;
  byte bVar31;
  GlobOpt *value;
  Instr *local_70;
  PropertySym *local_68;
  PropertySym *local_60;
  GlobOpt *local_58;
  undefined8 uStack_50;
  SymOpnd *local_48;
  Opnd *opnd_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType profiledArrayType;
  ValueType valueType;
  
  local_58 = this;
  local_48 = (SymOpnd *)opnd;
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd07,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar4) goto LAB_0044a1fb;
    *puVar12 = 0;
  }
  pGVar28 = local_58;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    pIVar25 = *pInstr;
    if (((pIVar25->m_src1 != opnd) && (pIVar25->m_src2 != opnd)) &&
       ((pIVar25->m_dst != opnd || (OVar5 = IR::Opnd::GetKind(opnd), OVar5 != OpndKindIndir))))
    goto LAB_00448d94;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_00448d94:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd0b,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar4) goto LAB_0044a1fb;
    *puVar12 = 0;
    pGVar28 = local_58;
  }
  opnd_local = (Opnd *)pInstr;
  OVar5 = IR::Opnd::GetKind(opnd);
  pVVar13 = (Value *)0x0;
  switch(OVar5) {
  case OpndKindIntConst:
    OVar5 = IR::Opnd::GetKind(opnd);
    pOVar30 = opnd_local;
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    intConst = IR::IntConstOpnd::AsInt32((IntConstOpnd *)opnd);
LAB_00448e86:
    pIVar25 = (Instr *)pOVar30->_vptr_Opnd;
LAB_00448e8e:
    pVVar13 = GetIntConstantValue(pGVar28,intConst,pIVar25,(Opnd *)0x0);
    break;
  case OpndKindInt64Const:
    OVar5 = IR::Opnd::GetKind(opnd);
    pOVar30 = opnd_local;
    if (OVar5 != OpndKindInt64Const) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    pVVar13 = GetIntConstantValue(pGVar28,(int64)opnd[1]._vptr_Opnd,(Instr *)pOVar30->_vptr_Opnd,
                                  (Opnd *)0x0);
    break;
  case OpndKindFloatConst:
    OVar5 = IR::Opnd::GetKind(opnd);
    pOVar30 = opnd_local;
    if (OVar5 != OpndKindFloatConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x107,"(this->IsFloatConstOpnd())","Bad call to AsFloatConstOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    value = (GlobOpt *)opnd[1]._vptr_Opnd;
    if (((double)value == (double)(int)(double)value) &&
       (!NAN((double)value) && !NAN((double)(int)(double)value))) {
      uStack_50 = 0;
      local_58 = value;
      bVar4 = Js::NumberUtilities::IsSpecial((double)value,0x8000000000000000);
      value = local_58;
      if (bVar4) goto LAB_00449151;
      intConst = (int32)(double)local_58;
      pIVar25 = (Instr *)pOVar30->_vptr_Opnd;
      goto LAB_00448e8e;
    }
LAB_00449151:
    pVVar13 = NewFloatConstantValue(pGVar28,(FloatConstType)value,(Opnd *)0x0);
    break;
  default:
    goto switchD_00448e18_caseD_4;
  case OpndKindSym:
    pVVar29 = &ValueType::Uninitialized;
    IR::Opnd::SetValueType(opnd,(ValueType)0x9);
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    pPVar17 = (PropertySym *)opnd[1]._vptr_Opnd;
    SVar23 = (pPVar17->super_Sym).m_kind;
    if (SVar23 == SymKindStack) {
      uVar11 = pPVar17->m_propertyId;
      uVar24 = uVar11 & 0x100000;
      if ((uVar24 != 0) && (*(short *)&(pPVar17->super_Sym).field_0x16 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_0044a1fb;
        *puVar12 = 0;
        uVar11 = pPVar17->m_propertyId;
        uVar24 = uVar11 & 0x100000;
      }
      pOVar30 = opnd_local;
      pGVar28 = local_58;
      if (uVar24 == 0) {
        SVar23 = (pPVar17->super_Sym).m_kind;
        if (SVar23 != SymKindStack) goto LAB_00449496;
        if ((uVar11 >> 0x16 & 1) == 0) goto LAB_00449489;
        bVar4 = JITTimeWorkItem::IsLoopBody(*(JITTimeWorkItem **)(opnd_local->_vptr_Opnd[4] + 0x20))
        ;
        if (!bVar4) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody
                              (*(JITTimeWorkItem **)(pOVar30->_vptr_Opnd[4] + 0x20));
          bVar4 = JITTimeFunctionBody::HasProfileInfo(pJVar14);
          if (bVar4) {
            this_00 = Sym::AsStackSym((Sym *)pPVar17);
            AVar7 = StackSym::GetParamSlotNum(this_00);
            if (1 < AVar7) {
              pJVar14 = JITTimeWorkItem::GetJITFunctionBody
                                  (*(JITTimeWorkItem **)(pOVar30->_vptr_Opnd[4] + 0x20));
              this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar14);
              valueType_01 = JITTimeProfileInfo::GetParameterInfo(this_01,AVar7 - 2);
              pVVar13 = NewGenericValue(pGVar28,valueType_01,(Opnd *)0x0);
              break;
            }
          }
        }
      }
    }
    else {
LAB_00449496:
      if (SVar23 != SymKindProperty) {
        local_60 = (PropertySym *)0x0;
        pPVar15 = pPVar17;
        pGVar28 = local_58;
        goto LAB_0044977b;
      }
      if ((pPVar17->m_propertyId == 0x1cf) &&
         (pPVar15 = Sym::AsPropertySym((Sym *)pPVar17), (pPVar15->super_Sym).field_0x15 == '\0')) {
        pSVar22 = IR::Opnd::AsSymOpnd(opnd);
        bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar22);
        if (bVar4) {
          pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
LAB_00449bcc:
          pPVar18 = IR::Opnd::AsPropertySymOpnd(opnd);
          FinishOptPropOp(local_58,pIVar25,pPVar18,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
          return (Value *)0x0;
        }
      }
      else {
        pVVar13 = GlobOptBlockData::FindValue
                            (&local_58->currentBlock->globOptData,&pPVar17->m_stackSym->super_Sym);
        OVar5 = IR::Opnd::GetKind(opnd);
        if (OVar5 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar4) goto LAB_0044a1fb;
          *puVar12 = 0;
        }
        if (pVVar13 != (Value *)0x0) {
          pVVar29 = &pVVar13->valueInfo->super_ValueType;
        }
        *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&opnd[1].m_kind = pVVar29->field_0;
        OVar5 = IR::Opnd::GetKind(opnd);
        pOVar30 = opnd_local;
        if (OVar5 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar4) goto LAB_0044a1fb;
          *puVar12 = 0;
        }
        pGVar28 = local_58;
        local_68 = CopyPropPropertySymObj(local_58,(SymOpnd *)opnd,(Instr *)pOVar30->_vptr_Opnd);
        bVar4 = DoFieldCopyProp(pGVar28);
        pGVar28 = local_58;
        pPVar15 = local_68;
        if (bVar4) {
          OVar1 = ((Instr *)pOVar30->_vptr_Opnd)->m_opcode;
          if (OVar1 < BrOnHasProperty) {
            if ((OVar1 - 0x80 < 0xc) && ((0xc4fU >> (OVar1 - 0x80 & 0x1f) & 1) != 0)) {
              return (Value *)0x0;
            }
            if (OVar1 == BrOnHasLocalProperty) {
              return (Value *)0x0;
            }
          }
          else {
            if ((OVar1 - 500 < 5) && ((0x13U >> (OVar1 - 500 & 0x1f) & 1) != 0)) {
              return (Value *)0x0;
            }
            if (OVar1 - 0x102 < 2) {
              return (Value *)0x0;
            }
            if (OVar1 == BrOnNoLocalProperty) {
              return (Value *)0x0;
            }
          }
          bVar4 = IR::Instr::CallsGetter((Instr *)pOVar30->_vptr_Opnd);
          if (!bVar4) {
            local_60 = pPVar17;
            if ((pGVar28->prePassLoop != (Loop *)0x0) &&
               (bVar4 = DoFieldPRE(pGVar28,pGVar28->rootLoopPrePass), pOVar30 = opnd_local, bVar4))
            {
              if (((pGVar28->prePassLoop->field_0x178 & 0x80) == 0) &&
                 (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pGVar28->prePassLoop->fieldKilled,(local_68->super_Sym).m_id),
                 BVar6 == '\0')) {
                loop = pGVar28->rootLoopPrePass;
                pIVar25 = (Instr *)pOVar30->_vptr_Opnd;
                pPVar15 = Sym::AsPropertySym(&local_68->super_Sym);
                pGVar28 = local_58;
                SetLoopFieldInitialValue(local_58,loop,pIVar25,pPVar15,pPVar17);
              }
              bVar4 = IsPREInstrCandidateLoad(*(OpCode *)(pOVar30->_vptr_Opnd + 6));
              pPVar15 = local_68;
              if (bVar4) {
                key = &(local_68->super_Sym).m_id;
                bVar4 = JsUtil::
                        BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::ContainsKey(pGVar28->prePassInstrMap,key);
                pGVar28 = local_58;
                if (!bVar4) {
                  local_60 = (PropertySym *)local_58->prePassInstrMap;
                  local_70 = IR::Instr::CopyWithoutDst((Instr *)opnd_local->_vptr_Opnd);
                  JsUtil::
                  BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)local_60,key,&local_70);
                  local_60 = pPVar17;
                }
              }
            }
            goto LAB_0044977b;
          }
        }
        else {
          pSVar22 = IR::Opnd::AsSymOpnd(opnd);
          bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar22);
          if (bVar4) {
            pIVar25 = (Instr *)pOVar30->_vptr_Opnd;
            goto LAB_00449bcc;
          }
        }
      }
    }
    goto LAB_00449b9c;
  case OpndKindReg:
    IR::Opnd::SetValueType(opnd,(ValueType)0x9);
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    pPVar17 = (PropertySym *)opnd[1]._vptr_Opnd;
    pBVar26 = pGVar28->currentBlock;
    pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    GlobOptBlockData::MarkTempLastUse(&pBVar26->globOptData,pIVar25,(RegOpnd *)opnd);
    pGVar28 = local_58;
    if ((pPVar17->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    if ((pPVar17->m_propertyId & 0x10000) == 0) {
LAB_00449489:
      local_60 = (PropertySym *)0x0;
      pPVar15 = pPVar17;
    }
    else {
      if ((pPVar17->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_0044a1fb;
        *puVar12 = 0;
      }
      pPVar15 = (PropertySym *)StackSym::GetVarEquivSym((StackSym *)pPVar17,pGVar28->func);
      local_60 = (PropertySym *)0x0;
    }
LAB_0044977b:
    pVVar13 = GlobOptBlockData::FindValue(&pGVar28->currentBlock->globOptData,&pPVar15->super_Sym);
    pOVar30 = opnd_local;
    if (pVVar13 == (Value *)0x0) {
      bVar4 = IR::Instr::TransfersSrcValue((Instr *)opnd_local->_vptr_Opnd);
      if (((bVar4) || (bVar4 = OpCodeAttr::CanCSE(*(OpCode *)(pOVar30->_vptr_Opnd + 6)), bVar4)) &&
         ((local_48 == (SymOpnd *)pOVar30->_vptr_Opnd[9] ||
          (local_48 == (SymOpnd *)pOVar30->_vptr_Opnd[10])))) {
        if ((pPVar15->super_Sym).m_kind == SymKindProperty) {
          pPVar17 = Sym::AsPropertySym(&pPVar15->super_Sym);
          pVVar13 = CreateFieldSrcValue(pGVar28,pPVar17,local_60,(Opnd **)&local_48,
                                        (Instr *)pOVar30->_vptr_Opnd);
        }
        else {
          pVVar13 = NewGenericValue(pGVar28,(ValueType)0x9,&local_48->super_Opnd);
        }
      }
      else {
        pVVar13 = (Value *)0x0;
      }
    }
    else {
      bVar4 = GlobOptBlockData::IsLive(&pGVar28->currentBlock->globOptData,&pPVar15->super_Sym);
      if ((!bVar4) && ((pPVar15->super_Sym).m_kind != SymKindProperty)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xdc5,"(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()))",
                           "CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym())");
        if (!bVar4) goto LAB_0044a1fb;
        *puVar12 = 0;
      }
      if ((Instr *)opnd_local->_vptr_Opnd != (Instr *)0x0) {
        local_48 = (SymOpnd *)
                   CopyProp(pGVar28,&local_48->super_Opnd,(Instr *)opnd_local->_vptr_Opnd,pVVar13,
                            parentIndirOpnd);
      }
      if (local_48 == (SymOpnd *)0x0) goto LAB_00449b9c;
      if (((((pGVar28->prePassLoop != (Loop *)0x0) && ((pPVar15->super_Sym).m_kind == SymKindStack))
           && (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (pGVar28->rootLoopPrePass->symsUsedBeforeDefined,
                                  (pPVar15->super_Sym).m_id), BVar6 == '\0')) &&
          ((bVar4 = GlobOptBlockData::IsLive
                              (&pGVar28->rootLoopPrePass->landingPad->globOptData,
                               &pPVar15->super_Sym), bVar4 && ((pGVar28->field_0xf7 & 2) == 0)))) &&
         ((pVVar16 = GlobOptBlockData::FindValue
                               (&pGVar28->rootLoopPrePass->landingPad->globOptData,
                                &pPVar15->super_Sym), pVVar16 != (Value *)0x0 &&
          (pVVar13->valueNumber == pVVar16->valueNumber)))) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (pGVar28->rootLoopPrePass->symsUsedBeforeDefined,(pPVar15->super_Sym).m_id);
        pVVar29 = &pVVar16->valueInfo->super_ValueType;
        bVar4 = ValueType::IsLikelyNumber(pVVar29);
        if (bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (pGVar28->rootLoopPrePass->likelyNumberSymsUsedBeforeDefined,
                     (pPVar15->super_Sym).m_id);
          if ((pGVar28->field_0xf5 & 2) == 0) {
            bVar4 = ValueType::IsInt(pVVar29);
          }
          else {
            bVar4 = ValueType::IsLikelyInt(pVVar29);
          }
          pGVar28 = local_58;
          if (bVar4 != false) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (local_58->rootLoopPrePass->likelyIntSymsUsedBeforeDefined,
                       (pPVar15->super_Sym).m_id);
          }
        }
      }
    }
    OVar5 = IR::Opnd::GetKind(&local_48->super_Opnd);
    pSVar22 = local_48;
    if (OVar5 == OpndKindSym) {
      OVar5 = IR::Opnd::GetKind(&local_48->super_Opnd);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_0044a1fb;
        *puVar12 = 0;
        pGVar28 = local_58;
      }
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar22);
      pOVar30 = opnd_local;
      if (bVar4) {
        TryOptimizeInstrWithFixedDataProperty(pGVar28,(Instr **)opnd_local);
        pIVar25 = (Instr *)pOVar30->_vptr_Opnd;
        pPVar18 = IR::Opnd::AsPropertySymOpnd(&local_48->super_Opnd);
        FinishOptPropOp(pGVar28,pIVar25,pPVar18,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
      }
    }
    if (pVVar13 != (Value *)0x0) {
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVVar13->valueInfo->super_ValueType).field_0.field_0;
      bVar4 = ValueType::IsLikelyArray((ValueType *)&local_32[0].field_0);
      if (((bVar4) && (bVar4 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0), !bVar4)) &&
         ((bVar4 = ValueType::IsObject((ValueType *)&local_32[0].field_0), !bVar4 &&
          (((Instr *)opnd_local->_vptr_Opnd)->m_kind == InstrKindProfiled)))) {
        pPVar19 = IR::Instr::AsProfiledInstr((Instr *)opnd_local->_vptr_Opnd);
        ValueType::ValueType((ValueType *)&local_34.field_0);
        pp_Var27 = opnd_local->_vptr_Opnd;
        uVar2 = *(ushort *)(pp_Var27 + 6);
        bVar31 = 1;
        if (uVar2 < 0xa6) {
          if (uVar2 == 0x97) {
            OVar5 = IR::Opnd::GetKind((Opnd *)pp_Var27[9]);
            pSVar22 = local_48;
            if ((OVar5 == OpndKindIndir) &&
               (pIVar20 = IR::Opnd::AsIndirOpnd((Opnd *)opnd_local->_vptr_Opnd[9]),
               pSVar22 == (SymOpnd *)pIVar20->m_baseOpnd)) {
LAB_00449df3:
              local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar19->u).ldElemInfo;
              bVar31 = ((anon_union_1_2_471f577c_for_LdElemInfo_3 *)
                       ((long)(pPVar19->u).ldElemInfo + 5))->bits & 4;
LAB_00449e02:
              bVar31 = bVar31 == 0;
            }
          }
          else if ((uVar2 == 0x9a) || (uVar2 == 0x9c)) {
LAB_00449d39:
            OVar5 = IR::Opnd::GetKind((Opnd *)pp_Var27[8]);
            pSVar22 = local_48;
            if ((OVar5 == OpndKindIndir) &&
               (pIVar20 = IR::Opnd::AsIndirOpnd((Opnd *)opnd_local->_vptr_Opnd[8]),
               pSVar22 == (SymOpnd *)pIVar20->m_baseOpnd)) {
              local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar19->u).stElemInfo;
              bVar31 = ((anon_union_1_2_471f577c_for_StElemInfo_2 *)
                       ((long)(pPVar19->u).stElemInfo + 3))->bits & 0x40;
              goto LAB_00449e02;
            }
          }
        }
        else if (uVar2 == 0xa6) {
          OVar5 = IR::Opnd::GetKind((Opnd *)pp_Var27[9]);
          if ((OVar5 == OpndKindReg) && (local_48 == (SymOpnd *)opnd_local->_vptr_Opnd[9])) {
            local_34 = (anon_union_2_4_ea848c7b_for_ValueType_13)
                       (pPVar19->u).field_3.ldLenInfoData.f1;
            bVar31 = *(byte *)((long)&pPVar19->u + 6) ^ 1;
          }
        }
        else if (uVar2 == 0xbb) {
          OVar5 = IR::Opnd::GetKind((Opnd *)pp_Var27[10]);
          if ((OVar5 == OpndKindReg) && (local_48 == (SymOpnd *)opnd_local->_vptr_Opnd[10]))
          goto LAB_00449df3;
        }
        else if (uVar2 == 0x22c) goto LAB_00449d39;
        bVar4 = ValueType::IsLikelyObject((ValueType *)&local_34.field_0);
        pGVar28 = local_58;
        if (bVar4) {
          OVar8 = ValueType::GetObjectType((ValueType *)&local_34.field_0);
          OVar9 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
          if ((bVar31 & 1) == 0) {
            if ((OVar8 != OVar9) ||
               ((bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0),
                pGVar28 = local_58, bVar4 &&
                ((bVar4 = ValueType::HasVarElements((ValueType *)&local_34.field_0), bVar4 ||
                 ((bVar4 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0),
                  pGVar28 = local_58, bVar4 &&
                  (bVar4 = ValueType::HasFloatElements((ValueType *)&local_34.field_0),
                  pGVar28 = local_58, bVar4)))))))) {
              bVar4 = ValueType::IsLikelyArray((ValueType *)&local_34.field_0);
              valueType_00 = local_34;
              if (bVar4) {
                ValueType::Verify((ValueType)local_32[0].field_0);
                ValueType::Verify((ValueType)valueType_00.field_0);
                bVar4 = ValueType::operator==
                                  ((ValueType *)&local_32[0].field_0,(ValueType)valueType_00.field_0
                                  );
                aVar10 = local_32[0];
                if (!bVar4) {
                  ValueType::ValueType((ValueType *)&local_70,local_32[0].bits | valueType_00.bits);
                  bVar4 = ValueType::OneOn((ValueType *)&local_70,Object);
                  if (bVar4) {
                    aVar10.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)&local_32[0].field_0,valueType_00.field_0);
                  }
                  else {
                    aVar10.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_70._0_2_);
                  }
                }
                local_70 = (Instr *)CONCAT62(local_70._2_6_,aVar10.bits);
                bVar4 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
                local_32[0].field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::SetHasNoMissingValues((ValueType *)&local_70,bVar4);
              }
              else {
                ValueType::Verify((ValueType)local_32[0].field_0);
                ValueType::Verify((ValueType)valueType_00.field_0);
                bVar4 = ValueType::operator==
                                  ((ValueType *)&local_32[0].field_0,(ValueType)valueType_00.field_0
                                  );
                if (!bVar4) {
                  ValueType::ValueType((ValueType *)&local_70,local_32[0].bits | valueType_00.bits);
                  bVar4 = ValueType::OneOn((ValueType *)&local_70,Object);
                  if (bVar4) {
                    local_32[0].field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)&local_32[0].field_0,valueType_00.field_0);
                  }
                  else {
                    local_32[0].field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_70._0_2_);
                  }
                }
              }
              pGVar28 = local_58;
              pBVar26 = local_58->currentBlock;
              pRVar21 = IR::Opnd::AsRegOpnd(&local_48->super_Opnd);
              pVVar16 = GlobOptBlockData::FindValue
                                  (&pBVar26->globOptData,&pRVar21->m_sym->super_Sym);
              bVar4 = true;
              goto LAB_0044a0d7;
            }
          }
          else {
            pGVar28 = local_58;
            if (((OVar8 == OVar9) &&
                (bVar4 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0),
                pGVar28 = local_58, !bVar4)) &&
               ((bVar4 = ValueType::HasIntElements((ValueType *)&local_34.field_0), bVar4 ||
                ((bVar4 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0),
                 pGVar28 = local_58, bVar4 &&
                 (bVar4 = ValueType::HasFloatElements((ValueType *)&local_34.field_0),
                 pGVar28 = local_58, bVar4)))))) {
              bVar4 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
              local_32[0].field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetHasNoMissingValues((ValueType *)&local_34.field_0,bVar4);
              pGVar28 = local_58;
              pBVar26 = local_58->currentBlock;
              pRVar21 = IR::Opnd::AsRegOpnd(&local_48->super_Opnd);
              pVVar16 = GlobOptBlockData::FindValue
                                  (&pBVar26->globOptData,&pRVar21->m_sym->super_Sym);
              bVar4 = false;
LAB_0044a0d7:
              ChangeValueType(pGVar28,pBVar26,pVVar16,(ValueType)local_32[0].field_0,false,bVar4);
              pGVar28 = local_58;
            }
          }
        }
      }
      IR::Opnd::SetValueType(&local_48->super_Opnd,(ValueType)local_32[0].field_0);
      if (pGVar28->prePassLoop != (Loop *)0x0) {
        return pVVar13;
      }
      OVar5 = IR::Opnd::GetKind(&local_48->super_Opnd);
      if (OVar5 != OpndKindSym) {
        return pVVar13;
      }
      bVar4 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0);
      if ((!bVar4) &&
         (bVar4 = ValueType::IsNotTaggedValue((ValueType *)&local_32[0].field_0), !bVar4)) {
        return pVVar13;
      }
      pSVar22 = IR::Opnd::AsSymOpnd(&local_48->super_Opnd);
      if (pSVar22->m_sym->m_kind != SymKindProperty) {
        return pVVar13;
      }
      bVar4 = DoFieldCopyProp(pGVar28);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xe5d,"(DoFieldCopyProp())","DoFieldCopyProp()");
        if (!bVar4) {
LAB_0044a1fb:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar12 = 0;
      }
      CaptureNoImplicitCallUses(pGVar28,&local_48->super_Opnd,false,(Instr *)opnd_local->_vptr_Opnd)
      ;
      return pVVar13;
    }
    IR::Opnd::SetValueType(&local_48->super_Opnd,(ValueType)0x9);
    goto LAB_00449b9c;
  case OpndKindAddr:
    OVar5 = IR::Opnd::GetKind(opnd);
    pOVar30 = opnd_local;
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    if (((ushort)opnd[2].m_valueType.field_0 & 2) == 0) {
      bVar31 = *(byte *)((long)&opnd[2].m_valueType.field_0.bits + 1);
      if ((bVar31 != 10) && (bVar31 != 1)) {
LAB_004499cd:
        pVVar13 = GetVarConstantValue(pGVar28,(AddrOpnd *)opnd);
        return pVVar13;
      }
      pp_Var27 = opnd[2]._vptr_Opnd;
      if (((ulong)pp_Var27 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pp_Var27 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)pp_Var27 & 0xffff000000000000) != 0x1000000000000) goto LAB_004499cd;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_0044a1fb;
        *puVar12 = 0;
        pp_Var27 = opnd[2]._vptr_Opnd;
      }
      intConst = Js::TaggedInt::ToInt32(pp_Var27);
      goto LAB_00448e86;
    }
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody
                        (*(JITTimeWorkItem **)(pOVar30->_vptr_Opnd[4] + 0x20));
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar14);
    this_02 = JITTimeWorkItem::GetJITTimeInfo(*(JITTimeWorkItem **)(pOVar30->_vptr_Opnd[4] + 0x20));
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,FixedMethodsPhase,sourceContextId,functionId);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xd30,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                         ,"Fixed function address operand with fixed method calls phase disabled?");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
    }
    pVVar13 = NewFixedFunctionValue
                        (pGVar28,(JavascriptFunction *)opnd[2]._vptr_Opnd,(AddrOpnd *)opnd);
    break;
  case OpndKindIndir:
    OVar5 = IR::Opnd::GetKind(opnd);
    pOVar30 = opnd_local;
    if (OVar5 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_0044a1fb;
      *puVar12 = 0;
      pGVar28 = local_58;
    }
    OptimizeIndirUses(pGVar28,(IndirOpnd *)opnd,(Instr **)pOVar30,indirIndexValRef);
LAB_00449b9c:
    pVVar13 = (Value *)0x0;
    goto switchD_00448e18_caseD_4;
  }
  IR::Opnd::SetValueType
            (opnd,(ValueType)
                  *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   &(pVVar13->valueInfo->super_ValueType).field_0.field_0);
switchD_00448e18_caseD_4:
  return pVVar13;
}

Assistant:

Value*
GlobOpt::OptSrc(IR::Opnd *opnd, IR::Instr * *pInstr, Value **indirIndexValRef, IR::IndirOpnd *parentIndirOpnd)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    Sym *sym;
    Value *val;
    PropertySym *originalPropertySym = nullptr;

    switch(opnd->GetKind())
    {
    case IR::OpndKindIntConst:
        val = this->GetIntConstantValue(opnd->AsIntConstOpnd()->AsInt32(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindInt64Const:
        val = this->GetIntConstantValue(opnd->AsInt64ConstOpnd()->GetValue(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindFloatConst:
    {
        const FloatConstType floatValue = opnd->AsFloatConstOpnd()->m_value;
        int32 int32Value;
        if(Js::JavascriptNumber::TryGetInt32Value(floatValue, &int32Value))
        {
            val = GetIntConstantValue(int32Value, instr);
        }
        else
        {
            val = NewFloatConstantValue(floatValue);
        }
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    }

    case IR::OpndKindAddr:
        {
            IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
            if (addrOpnd->m_isFunction)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func), "Fixed function address operand with fixed method calls phase disabled?");
                val = NewFixedFunctionValue((Js::JavascriptFunction *)addrOpnd->m_address, addrOpnd);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            else if (addrOpnd->IsVar() && Js::TaggedInt::Is(addrOpnd->m_address))
            {
                val = this->GetIntConstantValue(Js::TaggedInt::ToInt32(addrOpnd->m_address), instr);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            val = this->GetVarConstantValue(addrOpnd);
            return val;
        }

    case IR::OpndKindSym:
    {
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsSymOpnd()->m_sym;

        // Don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsArgSlotSym())
        {
            return nullptr;
        }

        // Unless we have profile info, don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsParamSlotSym())
        {
            if (!instr->m_func->IsLoopBody() && instr->m_func->HasProfileInfo())
            {
                // Skip "this" pointer.
                int paramSlotNum = sym->AsStackSym()->GetParamSlotNum() - 2;
                if (paramSlotNum >= 0)
                {
                    const auto parameterType = instr->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotNum));
                    val = NewGenericValue(parameterType);
                    opnd->SetValueType(val->GetValueInfo()->Type());
                    return val;
                }
            }
            return nullptr;
        }

        if (!sym->IsPropertySym())
        {
            break;
        }
        originalPropertySym = sym->AsPropertySym();

        // Don't give a value to 'arguments' property sym to prevent field copy prop of 'arguments'
        if (originalPropertySym->AsPropertySym()->m_propertyId == Js::PropertyIds::arguments &&
            originalPropertySym->AsPropertySym()->m_fieldKind == PropertyKindData)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }

        Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
        opnd->AsSymOpnd()->SetPropertyOwnerValueType(
            objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

        
        sym = this->CopyPropPropertySymObj(opnd->AsSymOpnd(), instr);

        if (!DoFieldCopyProp())
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }
        switch (instr->m_opcode)
        {
            // These need the symbolic reference to the field, don't copy prop the value of the field
        case Js::OpCode::DeleteFld:
        case Js::OpCode::DeleteRootFld:
        case Js::OpCode::DeleteFldStrict:
        case Js::OpCode::DeleteRootFldStrict:
        case Js::OpCode::ScopedDeleteFld:
        case Js::OpCode::ScopedDeleteFldStrict:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::LdMethodFldPolyInlineMiss:
        case Js::OpCode::StSlotChkUndecl:
        case Js::OpCode::ScopedLdInst:
            return nullptr;
        };

        if (instr->CallsGetter())
        {
            return nullptr;
        }

        if (this->IsLoopPrePass() && this->DoFieldPRE(this->rootLoopPrePass))
        {
            if (!this->prePassLoop->allFieldsKilled && !this->prePassLoop->fieldKilled->Test(sym->m_id))
            {
                this->SetLoopFieldInitialValue(this->rootLoopPrePass, instr, sym->AsPropertySym(), originalPropertySym);
            }
            if (this->IsPREInstrCandidateLoad(instr->m_opcode))
            {
                // Foreach property sym, remember the first instruction that loads it.
                // Can this be done in one call?
                if (!this->prePassInstrMap->ContainsKey(sym->m_id))
                {
                    this->prePassInstrMap->AddNew(sym->m_id, instr->CopyWithoutDst());
                }
            }
        }
        break; 
    }
    case IR::OpndKindReg:
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsRegOpnd()->m_sym;
        CurrentBlockData()->MarkTempLastUse(instr, opnd->AsRegOpnd());
        if (sym->AsStackSym()->IsTypeSpec())
        {
            sym = sym->AsStackSym()->GetVarEquivSym(this->func);
        }
        break;

    case IR::OpndKindIndir:
        this->OptimizeIndirUses(opnd->AsIndirOpnd(), &instr, indirIndexValRef);
        return nullptr;

    default:
        return nullptr;
    }

    val = CurrentBlockData()->FindValue(sym);

    if (val)
    {
        Assert(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()));
        if (instr)
        {
            opnd = this->CopyProp(opnd, instr, val, parentIndirOpnd);
        }

        // Check if we freed the operand.
        if (opnd == nullptr)
        {
            return nullptr;
        }

        // In a loop prepass, determine stack syms that are used before they are defined in the root loop for which the prepass
        // is being done. This information is used to do type specialization conversions in the landing pad where appropriate.
        if(IsLoopPrePass() &&
            sym->IsStackSym() &&
            !rootLoopPrePass->symsUsedBeforeDefined->Test(sym->m_id) &&
            rootLoopPrePass->landingPad->globOptData.IsLive(sym) && !isAsmJSFunc) // no typespec in asmjs and hence skipping this
        {
            Value *const landingPadValue = rootLoopPrePass->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && val->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                rootLoopPrePass->symsUsedBeforeDefined->Set(sym->m_id);
                ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
                if(landingPadValueInfo->IsLikelyNumber())
                {
                    rootLoopPrePass->likelyNumberSymsUsedBeforeDefined->Set(sym->m_id);
                    if(DoAggressiveIntTypeSpec() ? landingPadValueInfo->IsLikelyInt() : landingPadValueInfo->IsInt())
                    {
                        // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
                        // specialization is enabled.
                        rootLoopPrePass->likelyIntSymsUsedBeforeDefined->Set(sym->m_id);
                    }
                }
            }
        }
    }
    else if ((instr->TransfersSrcValue() || OpCodeAttr::CanCSE(instr->m_opcode)) && (opnd == instr->GetSrc1() || opnd == instr->GetSrc2()))
    {
        if (sym->IsPropertySym())
        {
            val = this->CreateFieldSrcValue(sym->AsPropertySym(), originalPropertySym, &opnd, instr);
        }
        else
        {
            val = this->NewGenericValue(ValueType::Uninitialized, opnd);
        }
    }

    if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        TryOptimizeInstrWithFixedDataProperty(&instr);
        this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
    }

    if (val)
    {
        ValueType valueType(val->GetValueInfo()->Type());

        // This block uses per-instruction profile information on array types to optimize using the best available profile
        // information and to prevent infinite bailouts by ensuring array type information is updated on bailouts.
        if (valueType.IsLikelyArray() && !valueType.IsDefinite() && !valueType.IsObject() && instr->IsProfiledInstr())
        {
            // See if we have profile data for the array type
            IR::ProfiledInstr *const profiledInstr = instr->AsProfiledInstr();
            ValueType profiledArrayType;

            bool useAggressiveSpecialization = true;
            switch(instr->m_opcode)
            {
                case Js::OpCode::LdElemI_A:
                    if(instr->GetSrc1()->IsIndirOpnd() && opnd == instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::StElemI_A:
                case Js::OpCode::StElemI_A_Strict:
                case Js::OpCode::StElemC:
                    if(instr->GetDst()->IsIndirOpnd() && opnd == instr->GetDst()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.stElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.stElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::LdLen_A:
                    if(instr->GetSrc1()->IsRegOpnd() && opnd == instr->GetSrc1())
                    {
                        profiledArrayType = profiledInstr->u.LdLenInfo().GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.LdLenInfo().IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::IsIn:
                    if (instr->GetSrc2()->IsRegOpnd() && opnd == instr->GetSrc2())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;
            }

            if (profiledArrayType.IsLikelyObject())
            {
                // Ideally we want to use the most specialized type seen by this path, but when that causes bailouts use the least specialized type instead.
                if (useAggressiveSpecialization && 
                    profiledArrayType.GetObjectType() == valueType.GetObjectType() &&
                    !valueType.IsLikelyNativeIntArray() &&
                    (
                        profiledArrayType.HasIntElements() || (valueType.HasVarElements() && profiledArrayType.HasFloatElements())
                    ))
                {
                    // use the more specialized type profiled by the instruction.
                    valueType = profiledArrayType.SetHasNoMissingValues(valueType.HasNoMissingValues());
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false);
                }
                else if (!useAggressiveSpecialization && 
                    (profiledArrayType.GetObjectType() != valueType.GetObjectType() ||
                        (
                            valueType.IsLikelyNativeArray() &&
                            (
                                profiledArrayType.HasVarElements() || (valueType.HasIntElements() && profiledArrayType.HasFloatElements())
                            )
                        )
                    ))
                {
                    // Merge array type we pulled from profile with type propagated by dataflow.
                    if (profiledArrayType.IsLikelyArray())
                    {
                        valueType = valueType.Merge(profiledArrayType).SetHasNoMissingValues(valueType.HasNoMissingValues());
                    }
                    else
                    {
                        valueType = valueType.Merge(profiledArrayType);
                    }
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false, true);
                }
            }
        }

        opnd->SetValueType(valueType);

        if(!IsLoopPrePass() && opnd->IsSymOpnd() && (valueType.IsDefinite() || valueType.IsNotTaggedValue()))
        {
            if (opnd->AsSymOpnd()->m_sym->IsPropertySym())
            {
                // A property sym can only be guaranteed to have a definite value type when implicit calls are disabled from the
                // point where the sym was defined with the definite value type. Insert an instruction to indicate to the
                // dead-store pass that implicit calls need to be kept disabled until after this instruction.
                Assert(DoFieldCopyProp());
                CaptureNoImplicitCallUses(opnd, false, instr);
            }
        }
    }
    else
    {
        opnd->SetValueType(ValueType::Uninitialized);
    }

    return val;
}